

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall TPZSkylMatrix<double>::CopyFrom(TPZSkylMatrix<double> *this,TPZMatrix<double> *mat)

{
  TPZSkylMatrix<double> *A;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    A = (TPZSkylMatrix<double> *)__dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
    if (A != (TPZSkylMatrix<double> *)0x0) {
      (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4e])
                (this);
      Copy(this,A);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZSkylMatrix<double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.h",
             0x74);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }